

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O2

void __thiscall wasm::Fuzzer::checkInhabitable(Fuzzer *this)

{
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types;
  pointer pHVar1;
  pointer pHVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  undefined1 local_298 [8];
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> print;
  long local_200;
  ostream local_1f8 [376];
  Printed local_80;
  undefined1 local_58 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> verifiedInhabitable;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> inhabitable;
  
  types = &this->types;
  HeapTypeGenerator::makeInhabitable
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             &verifiedInhabitable.
              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,types);
  if (this->verbose == true) {
    std::operator<<((ostream *)&std::cout,"\nInhabitable types:\n\n");
    printTypes((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &verifiedInhabitable.
                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  HeapTypeGenerator::getInhabitable
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             &print.names._M_h._M_single_bucket,types);
  pHVar1 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pHVar2 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
           .super__Vector_impl_data._M_start;
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
            ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             &print.names._M_h._M_single_bucket);
  if (local_200 - (long)print.names._M_h._M_single_bucket == (long)pHVar1 - (long)pHVar2) {
    iVar3 = wasm::getTypeSystem();
    if (iVar3 == 0) {
      pHVar1 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar4 = (long)(this->types).
                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pHVar1;
      if (lVar4 != (long)inhabitable.
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_start -
                   (long)verifiedInhabitable.
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage) {
        Fatal::Fatal((Fatal *)&print.names._M_h._M_single_bucket);
        Fatal::operator<<((Fatal *)&print.names._M_h._M_single_bucket,
                          (char (*) [68])
                          "Number of inhabitable types does not match number of original types");
LAB_0016a713:
        Fatal::~Fatal((Fatal *)&print.names._M_h._M_single_bucket);
      }
      for (lVar8 = 0; lVar4 >> 3 != lVar8; lVar8 = lVar8 + 1) {
        if (pHVar1[lVar8].id !=
            verifiedInhabitable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage[lVar8].id) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&print.names._M_h._M_single_bucket,"",(allocator<char> *)&local_80);
          IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
          IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                    ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_298,types,
                     (string *)&print.names._M_h._M_single_bucket);
          std::__cxx11::string::~string((string *)&print.names._M_h._M_single_bucket);
          Fatal::Fatal((Fatal *)&print.names._M_h._M_single_bucket);
          std::operator<<(local_1f8,"makeInhabitable incorrectly changed type ");
          TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
          operator()(&local_80,
                     (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                      *)local_298,
                     (HeapType)
                     (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                     _M_impl.super__Vector_impl_data._M_start[lVar8].id);
          Fatal::operator<<((Fatal *)&print.names._M_h._M_single_bucket,&local_80);
LAB_0016a604:
          HeapType::Printed::~Printed(&local_80);
          goto LAB_0016a713;
        }
      }
    }
  }
  else {
    HeapTypeGenerator::getInhabitable
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_58,
               (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &verifiedInhabitable.
                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if ((long)verifiedInhabitable.
              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_start - (long)local_58 !=
        (long)inhabitable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_start -
        (long)verifiedInhabitable.
              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&print.names._M_h._M_single_bucket,"",(allocator<char> *)&local_80);
      IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
      IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_298,
                 (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                 &verifiedInhabitable.
                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (string *)&print.names._M_h._M_single_bucket);
      std::__cxx11::string::~string((string *)&print.names._M_h._M_single_bucket);
      uVar6 = (long)verifiedInhabitable.
                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                    super__Vector_impl_data._M_start - (long)local_58 >> 3;
      for (uVar7 = 0;
          (long)inhabitable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_start -
          (long)verifiedInhabitable.
                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage >> 3 != uVar7; uVar7 = uVar7 + 1) {
        uVar5 = uVar6 + 1;
        if ((uVar6 < uVar7) ||
           (uVar5 = uVar7,
           verifiedInhabitable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage[uVar7].id !=
           ((pointer)((long)local_58 + uVar7 * 8))->id)) {
          Fatal::Fatal((Fatal *)&print.names._M_h._M_single_bucket);
          std::operator<<(local_1f8,"Found uninhabitable type: ");
          TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
          operator()(&local_80,
                     (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                      *)local_298,
                     (HeapType)
                     verifiedInhabitable.
                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage[uVar5].id);
          Fatal::operator<<((Fatal *)&print.names._M_h._M_single_bucket,&local_80);
          goto LAB_0016a604;
        }
      }
      IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::~IndexedTypeNameGenerator
                ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_298);
    }
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_58);
  }
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
            ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             &verifiedInhabitable.
              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Fuzzer::checkInhabitable() {
  std::vector<HeapType> inhabitable = HeapTypeGenerator::makeInhabitable(types);
  if (verbose) {
    std::cout << "\nInhabitable types:\n\n";
    printTypes(inhabitable);
  }

  // Check whether any of the original types are uninhabitable.
  bool haveUninhabitable =
    HeapTypeGenerator::getInhabitable(types).size() != types.size();
  if (haveUninhabitable) {
    // Verify that the transformed types are inhabitable.
    auto verifiedInhabitable = HeapTypeGenerator::getInhabitable(inhabitable);
    if (verifiedInhabitable.size() != inhabitable.size()) {
      IndexedTypeNameGenerator print(inhabitable);
      for (size_t i = 0; i < inhabitable.size(); ++i) {
        if (i > verifiedInhabitable.size() ||
            inhabitable[i] != verifiedInhabitable[i]) {
          Fatal() << "Found uninhabitable type: " << print(inhabitable[i]);
        }
      }
    }
    // TODO: We could also check that the transformed types are the same as the
    // original types up to nullability.
  } else if (getTypeSystem() == TypeSystem::Isorecursive) {
    // Verify the produced inhabitable types are the same as the original types
    // (which also implies that they are indeed inhabitable).
    if (types.size() != inhabitable.size()) {
      Fatal() << "Number of inhabitable types does not match number of "
                 "original types";
    }
    for (size_t i = 0; i < types.size(); ++i) {
      if (types[i] != inhabitable[i]) {
        IndexedTypeNameGenerator print(types);
        Fatal() << "makeInhabitable incorrectly changed type "
                << print(types[i]);
      }
    }
  }
}